

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O1

void __thiscall
Catch::clara::detail::BasicResult<void>::BasicResult
          (BasicResult<void> *this,Type type,string *message)

{
  pointer pcVar1;
  
  (this->super_ResultValueBase<void>).super_ResultBase.m_type = type;
  (this->super_ResultValueBase<void>).super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_001adf28;
  (this->m_errorMessage)._M_dataplus._M_p = (pointer)&(this->m_errorMessage).field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_errorMessage,pcVar1,pcVar1 + message->_M_string_length);
  if ((this->super_ResultValueBase<void>).super_ResultBase.m_type != Ok) {
    return;
  }
  __assert_fail("m_type != ResultBase::Ok",
                "/workspace/llm4binary/github/license_all_cmakelists_25/olivermichel[P]libom2/test/include/catch.h"
                ,0x234b,
                "Catch::clara::detail::BasicResult<>::BasicResult(ResultBase::Type, const std::string &) [T = void]"
               );
}

Assistant:

BasicResult( ResultBase::Type type, std::string const &message )
        :   ResultValueBase<T>(type),
            m_errorMessage(message)
        {
            assert( m_type != ResultBase::Ok );
        }